

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O3

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  secp256k1_fe *r;
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  secp256k1_ge **ppsVar5;
  long lVar6;
  secp256k1_ge *extraout_RDX;
  ulong heap_size;
  bool bVar7;
  secp256k1_ge *arr;
  secp256k1_context *ctx;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  size_t sStack_b8;
  secp256k1_ge *psStack_b0;
  secp256k1_ge *psStack_a8;
  byte abStack_a0 [32];
  byte abStack_80 [40];
  uchar *puStack_58;
  secp256k1_fe *psStack_50;
  
  secp256k1_ge_verify(elem);
  iVar4 = 0;
  if (elem->infinity == 0) {
    secp256k1_fe_normalize_var(&elem->x);
    r = &elem->y;
    secp256k1_fe_normalize_var(r);
    arr = elem;
    secp256k1_fe_get_b32(pub + 1,&elem->x);
    if (compressed == 0) {
      *size = 0x41;
      *pub = '\x04';
      secp256k1_fe_get_b32(pub + 0x21,r);
    }
    else {
      *size = 0x21;
      ctx = (secp256k1_context *)r;
      secp256k1_fe_verify(r);
      if ((elem->y).normalized == 0) {
        secp256k1_eckey_pubkey_serialize_cold_1();
        psStack_50 = r;
        puStack_58 = pub;
        if (ctx == (secp256k1_context *)0x0) {
          secp256k1_ec_pubkey_cmp_cold_1();
          if (ctx == (secp256k1_context *)0x0) {
            secp256k1_ec_pubkey_sort_cold_2();
          }
          else if (arr != (secp256k1_ge *)0x0) {
            if (heap_size < 2) {
              return 1;
            }
            uVar8 = heap_size >> 1;
            do {
              uVar8 = uVar8 - 1;
              secp256k1_heap_down((uchar *)arr,uVar8,heap_size,(size_t)ctx,in_R8,in_R9);
              uVar2 = heap_size;
            } while (uVar8 != 0);
            do {
              uVar8 = uVar2 - 1;
              uVar1 = (arr->x).n[0];
              (arr->x).n[0] = (arr->x).n[uVar2 - 1];
              (arr->x).n[uVar2 - 1] = uVar1;
              secp256k1_heap_down((uchar *)arr,0,uVar8,(size_t)ctx,in_R8,in_R9);
              uVar2 = uVar8;
            } while (1 < uVar8);
            return 1;
          }
          secp256k1_ec_pubkey_sort_cold_1();
          return 0;
        }
        psStack_b0 = arr;
        psStack_a8 = extraout_RDX;
        ppsVar5 = &psStack_b0;
        pbVar9 = abStack_a0;
        bVar10 = true;
        do {
          bVar7 = bVar10;
          sStack_b8 = 0x21;
          iVar4 = secp256k1_ec_pubkey_serialize
                            (ctx,pbVar9,&sStack_b8,(secp256k1_pubkey *)*ppsVar5,0x102);
          if (iVar4 == 0) {
            pbVar9[0x10] = 0;
            pbVar9[0x11] = 0;
            pbVar9[0x12] = 0;
            pbVar9[0x13] = 0;
            pbVar9[0x14] = 0;
            pbVar9[0x15] = 0;
            pbVar9[0x16] = 0;
            pbVar9[0x17] = 0;
            pbVar9[0x18] = 0;
            pbVar9[0x19] = 0;
            pbVar9[0x1a] = 0;
            pbVar9[0x1b] = 0;
            pbVar9[0x1c] = 0;
            pbVar9[0x1d] = 0;
            pbVar9[0x1e] = 0;
            pbVar9[0x1f] = 0;
            pbVar9[0] = 0;
            pbVar9[1] = 0;
            pbVar9[2] = 0;
            pbVar9[3] = 0;
            pbVar9[4] = 0;
            pbVar9[5] = 0;
            pbVar9[6] = 0;
            pbVar9[7] = 0;
            pbVar9[8] = 0;
            pbVar9[9] = 0;
            pbVar9[10] = 0;
            pbVar9[0xb] = 0;
            pbVar9[0xc] = 0;
            pbVar9[0xd] = 0;
            pbVar9[0xe] = 0;
            pbVar9[0xf] = 0;
            pbVar9[0x20] = 0;
          }
          ppsVar5 = &psStack_a8;
          pbVar9 = abStack_80 + 1;
          bVar10 = false;
        } while (bVar7);
        lVar6 = 0;
        do {
          pbVar9 = abStack_a0 + lVar6;
          lVar3 = lVar6 + 1;
          if (*pbVar9 != abStack_80[lVar3]) break;
          bVar10 = lVar6 != 0x20;
          lVar6 = lVar6 + 1;
        } while (bVar10);
        return (uint)*pbVar9 - (uint)abStack_80[lVar3];
      }
      *pub = (byte)r->n[0] & 1 | 2;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}